

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

ParserResult *
Catch::clara::detail::convertInto(ParserResult *__return_storage_ptr__,string *source,bool *target)

{
  bool bVar1;
  bool bVar2;
  string srcLC;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  ::std::__cxx11::string::string((string *)&local_88,(string *)source);
  ::std::
  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,Catch::clara::detail::convertInto(std::__cxx11::string_const&,bool&)::_lambda(unsigned_char)_1_>
            (local_88._M_dataplus._M_p,local_88._M_dataplus._M_p + local_88._M_string_length,
             local_88._M_dataplus._M_p);
  bVar1 = ::std::operator==(&local_88,"y");
  bVar2 = true;
  if (!bVar1) {
    bVar1 = ::std::operator==(&local_88,"1");
    if (!bVar1) {
      bVar1 = ::std::operator==(&local_88,"true");
      if (!bVar1) {
        bVar1 = ::std::operator==(&local_88,"yes");
        if (!bVar1) {
          bVar1 = ::std::operator==(&local_88,"on");
          if (!bVar1) {
            bVar1 = ::std::operator==(&local_88,"n");
            if (!bVar1) {
              bVar1 = ::std::operator==(&local_88,"0");
              if (!bVar1) {
                bVar1 = ::std::operator==(&local_88,"false");
                if (!bVar1) {
                  bVar1 = ::std::operator==(&local_88,"no");
                  if (!bVar1) {
                    bVar1 = ::std::operator==(&local_88,"off");
                    if (!bVar1) {
                      ::std::operator+(&local_68,
                                       "Expected a boolean value but did not recognise: \'",source);
                      ::std::operator+(&local_48,&local_68,"\'");
                      BasicResult<Catch::clara::detail::ParseResultType>::runtimeError
                                (__return_storage_ptr__,&local_48);
                      ::std::__cxx11::string::~string((string *)&local_48);
                      ::std::__cxx11::string::~string((string *)&local_68);
                      goto LAB_001956a8;
                    }
                  }
                }
              }
            }
            bVar2 = false;
          }
        }
      }
    }
  }
  *target = bVar2;
  *(undefined8 *)
   &(__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
    super_ResultBase.m_type = 0;
  (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
  super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001d69c8;
  (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
  (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
  (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
LAB_001956a8:
  ::std::__cxx11::string::~string((string *)&local_88);
  return __return_storage_ptr__;
}

Assistant:

inline auto convertInto( std::string const &source, bool &target ) -> ParserResult {
        std::string srcLC = source;
        std::transform( srcLC.begin(), srcLC.end(), srcLC.begin(), []( unsigned char c ) { return static_cast<char>( std::tolower(c) ); } );
        if (srcLC == "y" || srcLC == "1" || srcLC == "true" || srcLC == "yes" || srcLC == "on")
            target = true;
        else if (srcLC == "n" || srcLC == "0" || srcLC == "false" || srcLC == "no" || srcLC == "off")
            target = false;
        else
            return ParserResult::runtimeError( "Expected a boolean value but did not recognise: '" + source + "'" );
        return ParserResult::ok( ParseResultType::Matched );
    }